

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

void anon_unknown.dwarf_415510::ensureExtensionsInit(Display *display,int screen)

{
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  
  pvVar1 = _glx_handle;
  if ((anonymous_namespace)::ensureExtensionsInit(_XDisplay*,int)::initialized != '\0') {
    return;
  }
  (anonymous_namespace)::ensureExtensionsInit(_XDisplay*,int)::initialized = 1;
  pvVar3 = _glx_handle;
  if (_glx_handle == (void *)0x0) {
    lVar4 = 0;
    do {
      pvVar3 = (void *)dlopen(*(undefined8 *)((long)&glad_glx_dlopen_handle()::NAMES + lVar4),1);
      if (pvVar3 != (void *)0x0) break;
      lVar4 = lVar4 + 8;
      pvVar3 = (void *)0x0;
    } while (lVar4 == 8);
  }
  _glx_handle = pvVar3;
  if (_glx_handle != (void *)0x0) {
    pvVar3 = (void *)dlsym(_glx_handle,"glXGetProcAddressARB");
    if (pvVar3 == (void *)0x0) {
      bVar5 = true;
    }
    else {
      iVar2 = gladLoadGLXUserPtr(display,screen,glad_glx_get_proc,pvVar3);
      bVar5 = iVar2 == 0;
    }
    if (((pvVar1 == (void *)0x0) && (bVar5)) && (_glx_handle != (void *)0x0)) {
      dlclose();
      _glx_handle = (void *)0x0;
    }
  }
  gladLoadGLXUserPtr(display,screen,glad_glx_get_proc_from_userptr,sf::priv::GlxContext::getFunction
                    );
  return;
}

Assistant:

void ensureExtensionsInit(::Display* display, int screen)
    {
        static bool initialized = false;
        if (!initialized)
        {
            initialized = true;

            // We don't check the return value since the extension
            // flags are cleared even if loading fails
            gladLoaderLoadGLX(display, screen);

            gladLoadGLX(display, screen, sf::priv::GlxContext::getFunction);
        }
    }